

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_sign(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  _func_char_ptr_uint *p_Var2;
  tclpkcs11_handle *handle;
  Tcl_Obj *pTVar3;
  Tcl_Obj *pTVar4;
  int iVar5;
  uchar *outbuf;
  unsigned_long uVar6;
  long *plVar7;
  Tcl_Obj *pTVar8;
  Tcl_Obj *pTVar9;
  uchar *outbuf_00;
  CK_MECHANISM *pCVar10;
  ProcErrorProc *pPVar11;
  long lVar12;
  char *pcVar13;
  CK_RV CVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int tcl_keylist_llength;
  CK_ULONG resultbuf_len;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG foundObjs;
  long slotid_long;
  Tcl_Obj **tcl_keylist_values;
  CK_MECHANISM mechanism_desc_512;
  CK_MECHANISM mechanism_desc;
  CK_OBJECT_CLASS objectclass_pk;
  CK_ATTRIBUTE template [2];
  uchar resultbuf [1024];
  uint local_50c;
  Tcl_Obj *local_508;
  Tcl_Obj *local_500;
  Tcl_Obj *local_4f8;
  Tcl_Obj *local_4f0;
  CK_ULONG local_4e8;
  unsigned_long local_4e0;
  CK_OBJECT_HANDLE local_4d8;
  CK_MECHANISM *local_4d0;
  ClientData local_4c8;
  CK_ULONG local_4c0;
  CK_SLOT_ID local_4b8;
  Tcl_Obj **local_4b0;
  CK_MECHANISM local_4a8;
  CK_MECHANISM local_488;
  undefined8 local_470;
  CK_ATTRIBUTE local_468;
  undefined8 uStack_450;
  undefined8 *local_448;
  undefined8 uStack_440;
  CK_BYTE local_438 [1032];
  
  local_488.ulParameterLen = 0;
  local_488.mechanism = 0x1201;
  local_488.pParameter = (CK_VOID_PTR)0x0;
  local_4a8.ulParameterLen = 0;
  local_4a8.mechanism = 0xd4321006;
  local_4a8.pParameter = (CK_VOID_PTR)0x0;
  local_468.pValue = (uchar *)0x0;
  local_448 = (undefined8 *)0x0;
  uStack_440 = 0;
  local_468.ulValueLen = 0;
  uStack_450 = 0;
  local_468.type = 0x102;
  pTVar9 = objv[1];
  pTVar1 = objv[2];
  pTVar8 = objv[3];
  p_Var2 = tclStubsPtr->tcl_Alloc;
  local_4c8 = cd;
  iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  outbuf = (uchar *)(*p_Var2)(iVar5 / 2);
  iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  uVar6 = tclpkcs11_string_to_bytearray(pTVar1,outbuf,(long)(iVar5 / 2));
  plVar7 = (long *)(*tclStubsPtr->tcl_GetString)(pTVar9);
  auVar15[0] = -((char)*plVar7 == 'C');
  auVar15[1] = -(*(char *)((long)plVar7 + 1) == 'K');
  auVar15[2] = -(*(char *)((long)plVar7 + 2) == 'M');
  auVar15[3] = -(*(char *)((long)plVar7 + 3) == '_');
  auVar15[4] = -(*(char *)((long)plVar7 + 4) == 'G');
  auVar15[5] = -(*(char *)((long)plVar7 + 5) == 'O');
  auVar15[6] = -(*(char *)((long)plVar7 + 6) == 'S');
  auVar15[7] = -(*(char *)((long)plVar7 + 7) == 'T');
  auVar15[8] = -((char)plVar7[1] == 'R');
  auVar15[9] = -(*(char *)((long)plVar7 + 9) == '3');
  auVar15[10] = -(*(char *)((long)plVar7 + 10) == '4');
  auVar15[0xb] = -(*(char *)((long)plVar7 + 0xb) == '1');
  auVar15[0xc] = -(*(char *)((long)plVar7 + 0xc) == '0');
  auVar15[0xd] = -(*(char *)((long)plVar7 + 0xd) == '_');
  auVar15[0xe] = -(*(char *)((long)plVar7 + 0xe) == '5');
  auVar15[0xf] = -(*(char *)((long)plVar7 + 0xf) == '1');
  auVar16[0] = -((char)plVar7[2] == '2');
  auVar16[1] = 0xff;
  auVar16[2] = 0xff;
  auVar16[3] = 0xff;
  auVar16[4] = 0xff;
  auVar16[5] = 0xff;
  auVar16[6] = 0xff;
  auVar16[7] = 0xff;
  auVar16[8] = 0xff;
  auVar16[9] = 0xff;
  auVar16[10] = 0xff;
  auVar16[0xb] = 0xff;
  auVar16[0xc] = 0xff;
  auVar16[0xd] = 0xff;
  auVar16[0xe] = 0xff;
  auVar16[0xf] = 0xff;
  auVar16 = auVar16 & auVar15;
  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
    local_4e8 = 0x80;
    if ((int)uVar6 == 0x40) {
      pCVar10 = &local_4a8;
LAB_00106166:
      if (1 < pTVar8->refCount) {
        pTVar8 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar8);
      }
      iVar5 = (*tclStubsPtr->tcl_ListObjGetElements)
                        ((Tcl_Interp_conflict *)interp,pTVar8,(int *)&local_50c,&local_4b0);
      if (iVar5 != 0) {
        return iVar5;
      }
      if ((local_50c & 1) == 0) {
        local_4e0 = uVar6;
        local_4d0 = pCVar10;
        if ((int)local_50c < 1) {
          local_500 = (Tcl_Obj *)0x0;
          local_508 = (Tcl_Obj *)0x0;
          local_4f8 = (Tcl_Obj *)0x0;
          local_4f0 = (Tcl_Obj *)0x0;
        }
        else {
          lVar12 = 0;
          local_4f0 = (Tcl_Obj *)0x0;
          local_4f8 = (Tcl_Obj *)0x0;
          local_508 = (Tcl_Obj *)0x0;
          local_500 = (Tcl_Obj *)0x0;
          do {
            pTVar9 = local_4b0[lVar12];
            pTVar1 = local_4b0[lVar12 + 1];
            pcVar13 = (*tclStubsPtr->tcl_GetString)(pTVar9);
            iVar5 = strcmp(pcVar13,"pkcs11_handle");
            pTVar8 = local_508;
            pTVar3 = local_4f8;
            pTVar4 = pTVar1;
            if (iVar5 != 0) {
              pcVar13 = (*tclStubsPtr->tcl_GetString)(pTVar9);
              iVar5 = strcmp(pcVar13,"pkcs11_slotid");
              pTVar8 = local_508;
              pTVar3 = pTVar1;
              pTVar4 = local_4f0;
              if (iVar5 != 0) {
                pcVar13 = (*tclStubsPtr->tcl_GetString)(pTVar9);
                iVar5 = strcmp(pcVar13,"pkcs11_id");
                pTVar8 = pTVar1;
                pTVar3 = local_4f8;
                pTVar4 = local_4f0;
                if (iVar5 != 0) {
                  pcVar13 = (*tclStubsPtr->tcl_GetString)(pTVar9);
                  iVar5 = strcmp(pcVar13,"hobj_privkey");
                  pTVar8 = local_508;
                  pTVar3 = local_4f8;
                  pTVar4 = local_4f0;
                  if (iVar5 == 0) {
                    local_500 = pTVar1;
                  }
                }
              }
            }
            local_4f0 = pTVar4;
            local_4f8 = pTVar3;
            local_508 = pTVar8;
            lVar12 = lVar12 + 2;
          } while ((int)lVar12 < (int)local_50c);
        }
        pTVar1 = local_4f8;
        pTVar9 = local_500;
        if (local_4f0 == (Tcl_Obj *)0x0) {
          pPVar11 = tclStubsPtr->tcl_SetObjResult;
          pcVar13 = "could not find element named \"pkcs11_handle\" in keylist";
LAB_001063dd:
          pTVar9 = (*tclStubsPtr->tcl_NewStringObj)(pcVar13,-1);
          goto LAB_001062f4;
        }
        if (local_4f8 == (Tcl_Obj *)0x0) {
          pPVar11 = tclStubsPtr->tcl_SetObjResult;
          pcVar13 = "could not find element named \"pkcs11_slotid\" in keylist";
        }
        else if (local_508 == (Tcl_Obj *)0x0 && local_500 == (Tcl_Obj *)0x0) {
          pPVar11 = tclStubsPtr->tcl_SetObjResult;
          pcVar13 = "could not find element named \"pkcs11_id or hobj_privkey\" in keylist";
        }
        else {
          lVar12 = (**(code **)((long)local_4c8 + 0x40))();
          if (lVar12 != 0) {
            handle = *(tclpkcs11_handle **)(lVar12 + 0x18);
            if (handle == (tclpkcs11_handle *)0x0) {
              pPVar11 = tclStubsPtr->tcl_SetObjResult;
              pcVar13 = "invalid handle";
              goto LAB_001063dd;
            }
            iVar5 = (*tclStubsPtr->tcl_GetLongFromObj)
                              ((Tcl_Interp_conflict *)interp,pTVar1,(long *)&local_4b8);
            if (iVar5 != 0) {
              return iVar5;
            }
            iVar5 = tclpkcs11_start_session(handle,local_4b8);
            pTVar1 = local_508;
            if (iVar5 == 0) {
              if (pTVar9 == (Tcl_Obj *)0x0) {
                p_Var2 = tclStubsPtr->tcl_Alloc;
                iVar5 = (*tclStubsPtr->tcl_GetCharLength)(local_508);
                outbuf_00 = (uchar *)(*p_Var2)(iVar5 / 2);
                local_468.pValue = outbuf_00;
                iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
                local_468.ulValueLen =
                     tclpkcs11_string_to_bytearray(pTVar1,outbuf_00,(long)(iVar5 / 2));
                local_448 = &local_470;
                local_470 = 3;
                uStack_440 = 8;
                CVar14 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_468,2);
                if (CVar14 == 0) {
                  CVar14 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_4d8,1,&local_4c0)
                  ;
                  if (CVar14 != 0) {
                    pPVar11 = tclStubsPtr->tcl_SetObjResult;
                    pTVar9 = tclpkcs11_pkcs11_error(CVar14);
                    (*pPVar11)((Tcl_Interp_conflict *)interp,pTVar9);
                    (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                    return 1;
                  }
                  (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                  iVar5 = (int)local_4e0;
                  if (local_4c0 == 0) {
                    pPVar11 = tclStubsPtr->tcl_SetObjResult;
                    pcVar13 = "PKCS11_ERROR MAYBE_LOGIN";
                    goto LAB_001063dd;
                  }
                  goto LAB_001064a5;
                }
              }
              else {
                pcVar13 = (*tclStubsPtr->tcl_GetString)(pTVar9);
                pTVar9 = (*tclStubsPtr->tcl_NewStringObj)(pcVar13 + 4,-1);
                iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar9);
                tclpkcs11_string_to_bytearray(pTVar9,(uchar *)&local_4d8,(long)(iVar5 / 2));
                iVar5 = (int)local_4e0;
LAB_001064a5:
                CVar14 = (*handle->pkcs11->C_SignInit)(handle->session,local_4d0,local_4d8);
                if ((CVar14 == 0) &&
                   (CVar14 = (*handle->pkcs11->C_Sign)
                                       (handle->session,outbuf,(long)iVar5,local_438,&local_4e8),
                   CVar14 == 0)) {
                  pTVar9 = tclpkcs11_bytearray_to_string(local_438,local_4e8);
                  (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar9);
                  return 0;
                }
              }
              pPVar11 = tclStubsPtr->tcl_SetObjResult;
            }
            else {
              CVar14 = (CK_RV)iVar5;
              pPVar11 = tclStubsPtr->tcl_SetObjResult;
            }
            pTVar9 = tclpkcs11_pkcs11_error(CVar14);
            goto LAB_001062f4;
          }
          pPVar11 = tclStubsPtr->tcl_SetObjResult;
          pcVar13 = "invalid handle";
        }
        pTVar9 = (*tclStubsPtr->tcl_NewStringObj)(pcVar13,-1);
        goto LAB_001062f4;
      }
      pPVar11 = tclStubsPtr->tcl_SetObjResult;
      pcVar13 = "list must have an even number of elements";
    }
    else {
      pPVar11 = tclStubsPtr->tcl_SetObjResult;
      pcVar13 = "\"pki::pkcs11::sign CKM_GOSTR3410_512 input\" - bad len hash";
    }
  }
  else if (*(long *)((long)plVar7 + 5) == 0x303134335254534f && *plVar7 == 0x54534f475f4d4b43) {
    local_4e8 = 0x40;
    if ((int)uVar6 == 0x20) {
      pCVar10 = &local_488;
      goto LAB_00106166;
    }
    pPVar11 = tclStubsPtr->tcl_SetObjResult;
    pcVar13 = "\"pki::pkcs11::sign CKM_GOSTR3410 input\" - bad len hash";
  }
  else {
    pPVar11 = tclStubsPtr->tcl_SetObjResult;
    pcVar13 = "\"pki::pkcs11::sign CKM_GOSTR3410|CKM_GOSTR3410_512 input\" - bad sign";
  }
  pTVar9 = (*tclStubsPtr->tcl_NewStringObj)(pcVar13,-1);
LAB_001062f4:
  (*pPVar11)((Tcl_Interp_conflict *)interp,pTVar9);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_sign(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "SIGN START\n");
  return(tclpkcs11_perform_pki_sign(cd, interp, objc, objv));
}